

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O2

void __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::Surface
          (Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this,
          Ref<anurbs::NurbsSurfaceGeometry<2L>_> *geometry)

{
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_60;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> local_50;
  __shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  Interval local_30;
  Interval local_20;
  
  std::__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_40,
               (__shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)geometry);
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::data(&local_50);
  (*((local_50.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_EntryBase)._vptr_EntryBase[4])();
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::data(&local_60);
  (*((local_60.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_EntryBase)._vptr_EntryBase[5])();
  Surface(this,(Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_40,&local_30,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

Surface(TRef geometry) : Surface(geometry, geometry->domain_u(),
        geometry->domain_v())
    {
    }